

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O0

void __thiscall rw::PluginList::streamWrite(PluginList *this,Stream *stream,void *object)

{
  Plugin *pPVar1;
  int iVar2;
  Plugin *pPVar3;
  Plugin *p;
  LLLink *lnk;
  LLLink *_next;
  int size;
  void *object_local;
  Stream *stream_local;
  PluginList *this_local;
  
  iVar2 = streamGetSize(this,object);
  writeChunkHeader(stream,3,iVar2);
  pPVar1 = (Plugin *)(this->plugins).link.next;
  while( true ) {
    p = pPVar1;
    pPVar1 = *(Plugin **)p;
    pPVar3 = (Plugin *)LinkList::end(&this->plugins);
    if (p == pPVar3) break;
    if ((p[-1].inParentList.next != (LLLink *)0x0) &&
       (iVar2 = (*(code *)p[-1].inParentList.next)
                          (object,*(undefined4 *)&p[-1].copy,*(undefined4 *)((long)&p[-1].copy + 4))
       , 0 < iVar2)) {
      writeChunkHeader(stream,*(int32 *)&p[-1].read,iVar2);
      (*(code *)p[-1].parentList)
                (stream,iVar2,object,*(undefined4 *)&p[-1].copy,
                 *(undefined4 *)((long)&p[-1].copy + 4));
    }
  }
  return;
}

Assistant:

void
PluginList::streamWrite(Stream *stream, void *object)
{
	int size = this->streamGetSize(object);
	writeChunkHeader(stream, ID_EXTENSION, size);
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->getSize == nil ||
		   (size = p->getSize(object, p->offset, p->size)) <= 0)
			continue;
		writeChunkHeader(stream, p->id, size);
		p->write(stream, size, object, p->offset, p->size);
	}
}